

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O0

bool __thiscall CNode::IsOutboundOrBlockRelayConn(CNode *this)

{
  int iVar1;
  long in_RDI;
  long in_FS_OFFSET;
  bool local_9;
  
  iVar1 = *(int *)(in_RDI + 0x244);
  if (iVar1 != 0) {
    if (iVar1 == 1) {
LAB_010df5df:
      local_9 = true;
      goto LAB_010df60c;
    }
    if (1 < iVar1 - 2U) {
      if (iVar1 == 4) goto LAB_010df5df;
      if (iVar1 != 5) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.h"
                      ,0x301,"bool CNode::IsOutboundOrBlockRelayConn() const");
      }
    }
  }
  local_9 = false;
LAB_010df60c:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool IsOutboundOrBlockRelayConn() const {
        switch (m_conn_type) {
            case ConnectionType::OUTBOUND_FULL_RELAY:
            case ConnectionType::BLOCK_RELAY:
                return true;
            case ConnectionType::INBOUND:
            case ConnectionType::MANUAL:
            case ConnectionType::ADDR_FETCH:
            case ConnectionType::FEELER:
                return false;
        } // no default case, so the compiler can warn about missing cases

        assert(false);
    }